

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionAllocator.hpp
# Opt level: O1

void __thiscall
RegionDetector::RegionAllocator<RegionDetector::Region>::addChunk
          (RegionAllocator<RegionDetector::Region> *this)

{
  vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_> local_38;
  allocator_type local_19;
  
  std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>::vector
            (&local_38,this->chunkSize,&local_19);
  std::
  vector<std::vector<RegionDetector::Region,std::allocator<RegionDetector::Region>>,std::allocator<std::vector<RegionDetector::Region,std::allocator<RegionDetector::Region>>>>
  ::emplace_back<std::vector<RegionDetector::Region,std::allocator<RegionDetector::Region>>>
            ((vector<std::vector<RegionDetector::Region,std::allocator<RegionDetector::Region>>,std::allocator<std::vector<RegionDetector::Region,std::allocator<RegionDetector::Region>>>>
              *)this,&local_38);
  std::vector<RegionDetector::Region,_std::allocator<RegionDetector::Region>_>::~vector(&local_38);
  this->chunkPos = this->chunkPos + 1;
  this->regionPos = 0;
  return;
}

Assistant:

void addChunk() {
			pool.push_back(std::vector<REGION_TYPE>(chunkSize));
			chunkPos++;
			regionPos = 0;
		}